

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorK<8>_>,_false>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  undefined4 uVar16;
  ulong uVar17;
  vbool<8> *pvVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  AccelData *pAVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  Primitive *prim;
  bool bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar32;
  undefined1 in_ZMM0 [64];
  undefined1 auVar33 [64];
  vint4 ai_1;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  vint4 ai;
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined4 in_register_000014dc;
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  Precalculations pre;
  vbool<8> valid0;
  vint8 bi_1;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1371;
  AccelData *local_1370;
  ulong local_1368;
  vbool<8> *local_1360;
  RayK<8> *local_1358;
  RayK<8> *local_1350;
  RayQueryContext *local_1348;
  vbool<8> *local_1340;
  ulong local_1338;
  ulong local_1330;
  ulong local_1328;
  undefined1 local_1320 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_1300;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  undefined4 local_1220;
  undefined4 uStack_121c;
  undefined4 uStack_1218;
  undefined4 uStack_1214;
  undefined4 local_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  uint local_1200;
  uint uStack_11fc;
  uint uStack_11f8;
  uint uStack_11f4;
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  uint local_11c0;
  uint uStack_11bc;
  uint uStack_11b8;
  uint uStack_11b4;
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  uint local_11a0;
  uint uStack_119c;
  uint uStack_1198;
  uint uStack_1194;
  undefined1 local_1190 [16];
  uint local_1180;
  uint uStack_117c;
  uint uStack_1178;
  uint uStack_1174;
  undefined1 local_1170 [16];
  uint local_1160;
  uint uStack_115c;
  uint uStack_1158;
  uint uStack_1154;
  float local_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  anon_union_32_3_898e2e57_for_vint_impl<8>_1 local_10c0;
  undefined4 local_10a0;
  undefined4 uStack_109c;
  undefined4 uStack_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 uStack_1088;
  undefined4 uStack_1084;
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  undefined1 local_fe0 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_fc0;
  ulong local_fa0 [494];
  
  auVar30 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  local_1320 = vpcmpeqd_avx2((undefined1  [32])valid_i->field_0,auVar30);
  uVar15 = vmovmskps_avx(local_1320);
  if (uVar15 == 0) {
    return;
  }
  local_10c0.v = valid_i->field_0;
  pAVar24 = This->ptr;
  local_1368 = (ulong)(uVar15 & 0xff);
  auVar6 = vpcmpeqd_avx2(in_ZMM7._0_32_,in_ZMM7._0_32_);
  uStack_1284 = *(undefined4 *)(ray + 0x1c);
  uStack_12a4 = *(undefined4 *)(ray + 0x3c);
  auVar30 = *(undefined1 (*) [32])(ray + 0x80);
  auVar39._8_4_ = 0x7fffffff;
  auVar39._0_8_ = 0x7fffffff7fffffff;
  auVar39._12_4_ = 0x7fffffff;
  auVar39._16_4_ = 0x7fffffff;
  auVar39._20_4_ = 0x7fffffff;
  auVar39._24_4_ = 0x7fffffff;
  auVar39._28_4_ = 0x7fffffff;
  auVar34 = vandps_avx(auVar30,auVar39);
  auVar44._8_4_ = 0x219392ef;
  auVar44._0_8_ = 0x219392ef219392ef;
  auVar44._12_4_ = 0x219392ef;
  auVar44._16_4_ = 0x219392ef;
  auVar44._20_4_ = 0x219392ef;
  auVar44._24_4_ = 0x219392ef;
  auVar44._28_4_ = 0x219392ef;
  auVar34 = vcmpps_avx(auVar34,auVar44,1);
  auVar40 = vblendvps_avx(auVar30,auVar44,auVar34);
  auVar34 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar39);
  auVar34 = vcmpps_avx(auVar34,auVar44,1);
  auVar46 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar44,auVar34);
  auVar34 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar39);
  auVar34 = vcmpps_avx(auVar34,auVar44,1);
  auVar34 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar44,auVar34);
  auVar39 = vrcpps_avx(auVar40);
  auVar45._8_4_ = 0x3f800000;
  auVar45._0_8_ = &DAT_3f8000003f800000;
  auVar45._12_4_ = 0x3f800000;
  auVar45._16_4_ = 0x3f800000;
  auVar45._20_4_ = 0x3f800000;
  auVar45._24_4_ = 0x3f800000;
  auVar45._28_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar40,auVar39,auVar45);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar39,auVar39);
  auVar54 = ZEXT1664(auVar8);
  auVar40 = vrcpps_avx(auVar46);
  auVar9 = vfnmadd213ps_fma(auVar46,auVar40,auVar45);
  auVar46 = vrcpps_avx(auVar34);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar40,auVar40);
  auVar55 = ZEXT1664(auVar9);
  auVar42 = vfnmadd213ps_fma(auVar34,auVar46,auVar45);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar46,auVar46);
  auVar56 = ZEXT1664(auVar42);
  local_1060 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT832(0) << 0x20);
  local_1358 = ray + 0x100;
  local_1080 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT832(0) << 0x20);
  local_1320 = local_1320 ^ auVar6;
  auVar40 = ZEXT832(0) << 0x20;
  auVar30 = vcmpps_avx(auVar30,auVar40,1);
  auVar34._8_4_ = 1;
  auVar34._0_8_ = 0x100000001;
  auVar34._12_4_ = 1;
  auVar34._16_4_ = 1;
  auVar34._20_4_ = 1;
  auVar34._24_4_ = 1;
  auVar34._28_4_ = 1;
  auVar30 = vandps_avx(auVar30,auVar34);
  auVar34 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar40,1);
  auVar46._8_4_ = 2;
  auVar46._0_8_ = 0x200000002;
  auVar46._12_4_ = 2;
  auVar46._16_4_ = 2;
  auVar46._20_4_ = 2;
  auVar46._24_4_ = 2;
  auVar46._28_4_ = 2;
  auVar34 = vandps_avx(auVar34,auVar46);
  auVar34 = vorps_avx(auVar34,auVar30);
  auVar30 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar40,1);
  auVar40._8_4_ = 4;
  auVar40._0_8_ = 0x400000004;
  auVar40._12_4_ = 4;
  auVar40._16_4_ = 4;
  auVar40._20_4_ = 4;
  auVar40._24_4_ = 4;
  auVar40._28_4_ = 4;
  auVar30 = vandps_avx(auVar30,auVar40);
  auVar30 = vpor_avx2(local_1320,auVar30);
  local_10e0 = vpor_avx2(auVar30,auVar34);
  local_1000 = *(float *)ray;
  fStack_ffc = *(float *)(ray + 4);
  fStack_ff8 = *(float *)(ray + 8);
  fStack_ff4 = *(float *)(ray + 0xc);
  fStack_ff0 = *(float *)(ray + 0x10);
  fStack_fec = *(float *)(ray + 0x14);
  fStack_fe8 = *(float *)(ray + 0x18);
  uStack_fe4 = uStack_1284;
  local_12a0 = auVar8._0_4_ * -*(float *)ray;
  fStack_129c = auVar8._4_4_ * -*(float *)(ray + 4);
  fStack_1298 = auVar8._8_4_ * -*(float *)(ray + 8);
  fStack_1294 = auVar8._12_4_ * -*(float *)(ray + 0xc);
  fStack_1290 = -*(float *)(ray + 0x10) * 0.0;
  fStack_128c = -*(float *)(ray + 0x14) * 0.0;
  fStack_1288 = -*(float *)(ray + 0x18) * 0.0;
  local_1020 = *(float *)(ray + 0x20);
  fStack_101c = *(float *)(ray + 0x24);
  fStack_1018 = *(float *)(ray + 0x28);
  fStack_1014 = *(float *)(ray + 0x2c);
  fStack_1010 = *(float *)(ray + 0x30);
  fStack_100c = *(float *)(ray + 0x34);
  fStack_1008 = *(float *)(ray + 0x38);
  uStack_1004 = uStack_12a4;
  local_12c0 = auVar9._0_4_ * -*(float *)(ray + 0x20);
  fStack_12bc = auVar9._4_4_ * -*(float *)(ray + 0x24);
  fStack_12b8 = auVar9._8_4_ * -*(float *)(ray + 0x28);
  fStack_12b4 = auVar9._12_4_ * -*(float *)(ray + 0x2c);
  fStack_12b0 = -*(float *)(ray + 0x30) * 0.0;
  fStack_12ac = -*(float *)(ray + 0x34) * 0.0;
  fStack_12a8 = -*(float *)(ray + 0x38) * 0.0;
  local_1040 = *(float *)(ray + 0x40);
  fStack_103c = *(float *)(ray + 0x44);
  fStack_1038 = *(float *)(ray + 0x48);
  fStack_1034 = *(float *)(ray + 0x4c);
  fStack_1030 = *(float *)(ray + 0x50);
  fStack_102c = *(float *)(ray + 0x54);
  fStack_1028 = *(float *)(ray + 0x58);
  uStack_1024 = *(undefined4 *)(ray + 0x5c);
  local_12e0 = auVar42._0_4_ * -*(float *)(ray + 0x40);
  fStack_12dc = auVar42._4_4_ * -*(float *)(ray + 0x44);
  fStack_12d8 = auVar42._8_4_ * -*(float *)(ray + 0x48);
  fStack_12d4 = auVar42._12_4_ * -*(float *)(ray + 0x4c);
  fStack_12d0 = -*(float *)(ray + 0x50) * 0.0;
  fStack_12cc = -*(float *)(ray + 0x54) * 0.0;
  fStack_12c8 = -*(float *)(ray + 0x58) * 0.0;
  local_1230 = 0x80000000;
  uStack_122c = 0x80000000;
  uStack_1228 = 0x80000000;
  uStack_1224 = 0x80000000;
  local_10a0 = 0x7f800000;
  uStack_109c = 0x7f800000;
  uStack_1098 = 0x7f800000;
  uStack_1094 = 0x7f800000;
  uStack_1090 = 0x7f800000;
  uStack_108c = 0x7f800000;
  uStack_1088 = 0x7f800000;
  uStack_1084 = 0x7f800000;
  local_1100 = ZEXT1632(auVar8);
  local_1120 = ZEXT1632(auVar9);
  local_1140 = ZEXT1632(auVar42);
  local_1370 = pAVar24;
  local_1350 = ray;
  local_1348 = context;
  uStack_12c4 = in_register_000014dc;
LAB_0060f8f1:
  puVar19 = local_fa0 + 2;
  lVar7 = 0;
  for (uVar17 = local_1368; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
    lVar7 = lVar7 + 1;
  }
  uVar16 = *(undefined4 *)(local_10e0 + lVar7 * 4);
  auVar29._4_4_ = uVar16;
  auVar29._0_4_ = uVar16;
  auVar29._8_4_ = uVar16;
  auVar29._12_4_ = uVar16;
  auVar29._16_4_ = uVar16;
  auVar29._20_4_ = uVar16;
  auVar29._24_4_ = uVar16;
  auVar29._28_4_ = uVar16;
  local_1280 = vpcmpeqd_avx2(auVar29,local_10e0);
  uVar16 = vmovmskps_avx(local_1280);
  uVar17 = CONCAT44((int)((ulong)lVar7 >> 0x20),uVar16);
  local_1368 = ~uVar17 & local_1368;
  auVar52._8_4_ = 0x7f800000;
  auVar52._0_8_ = 0x7f8000007f800000;
  auVar52._12_4_ = 0x7f800000;
  auVar52._16_4_ = 0x7f800000;
  auVar52._20_4_ = 0x7f800000;
  auVar52._24_4_ = 0x7f800000;
  auVar52._28_4_ = 0x7f800000;
  auVar30 = vblendvps_avx(auVar52,auVar54._0_32_,local_1280);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar8 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar30 = vblendvps_avx(auVar52,auVar55._0_32_,local_1280);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar9 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar9 = vunpcklps_avx(auVar8,auVar9);
  auVar30 = vblendvps_avx(auVar52,auVar56._0_32_,local_1280);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar8 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar49._8_4_ = 0xff800000;
  auVar49._0_8_ = 0xff800000ff800000;
  auVar49._12_4_ = 0xff800000;
  auVar49._16_4_ = 0xff800000;
  auVar49._20_4_ = 0xff800000;
  auVar49._24_4_ = 0xff800000;
  auVar49._28_4_ = 0xff800000;
  auVar30 = vblendvps_avx(auVar49,auVar54._0_32_,local_1280);
  auVar38 = vinsertps_avx(auVar9,auVar8,0x28);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar34 = vmaxps_avx(auVar30,auVar34);
  auVar30 = vblendvps_avx(auVar49,auVar55._0_32_,local_1280);
  auVar8 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar9 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar9 = vunpcklps_avx(auVar8,auVar9);
  auVar30 = vblendvps_avx(auVar49,auVar56._0_32_,local_1280);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar8 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar3 = vinsertps_avx(auVar9,auVar8,0x28);
  auVar2 = vcmpps_avx(auVar38,_DAT_01feba10,5);
  auVar8 = vblendvps_avx(auVar3,auVar38,auVar2);
  auVar9 = vmovshdup_avx(auVar8);
  local_1328 = (ulong)(auVar9._0_4_ < 0.0) << 4 | 0x20;
  auVar9 = vshufpd_avx(auVar8,auVar8,1);
  uVar26 = (ulong)(auVar9._0_4_ < 0.0) << 4 | 0x40;
  local_1330 = local_1328 ^ 0x10;
  local_1150 = auVar8._0_4_;
  auVar14._4_4_ = fStack_ffc;
  auVar14._0_4_ = local_1000;
  auVar14._8_4_ = fStack_ff8;
  auVar14._12_4_ = fStack_ff4;
  auVar14._16_4_ = fStack_ff0;
  auVar14._20_4_ = fStack_fec;
  auVar14._24_4_ = fStack_fe8;
  auVar14._28_4_ = uStack_fe4;
  auVar30 = vblendvps_avx(auVar52,auVar14,local_1280);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar9 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar13._4_4_ = fStack_101c;
  auVar13._0_4_ = local_1020;
  auVar13._8_4_ = fStack_1018;
  auVar13._12_4_ = fStack_1014;
  auVar13._16_4_ = fStack_1010;
  auVar13._20_4_ = fStack_100c;
  auVar13._24_4_ = fStack_1008;
  auVar13._28_4_ = uStack_1004;
  auVar30 = vblendvps_avx(auVar52,auVar13,local_1280);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar42 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar42 = vunpcklps_avx(auVar9,auVar42);
  auVar6._4_4_ = fStack_103c;
  auVar6._0_4_ = local_1040;
  auVar6._8_4_ = fStack_1038;
  auVar6._12_4_ = fStack_1034;
  auVar6._16_4_ = fStack_1030;
  auVar6._20_4_ = fStack_102c;
  auVar6._24_4_ = fStack_1028;
  auVar6._28_4_ = uStack_1024;
  auVar30 = vblendvps_avx(auVar52,auVar6,local_1280);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar34);
  auVar9 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar42 = vinsertps_avx(auVar42,auVar9,0x28);
  auVar30 = vblendvps_avx(auVar49,auVar14,local_1280);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar9 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar30 = vblendvps_avx(auVar49,auVar13,local_1280);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar4 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar30 = vblendvps_avx(auVar49,auVar6,local_1280);
  auVar4 = vunpcklps_avx(auVar9,auVar4);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar9 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar4 = vinsertps_avx(auVar4,auVar9,0x28);
  auVar9 = vblendvps_avx(auVar4,auVar42,auVar2);
  auVar42 = vblendvps_avx(auVar42,auVar4,auVar2);
  local_1260 = vblendvps_avx(auVar49,local_1080,local_1280);
  auVar30 = vshufps_avx(local_1260,local_1260,0xb1);
  auVar30 = vmaxps_avx(local_1260,auVar30);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar34 = vmaxps_avx(auVar30,auVar34);
  auVar30 = vblendvps_avx(auVar52,local_1060,local_1280);
  auVar40 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vminps_avx(auVar30,auVar40);
  auVar40 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar40);
  auVar5 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar50 = ZEXT3264(CONCAT428(uStack_1284,
                               CONCAT424(fStack_1288,
                                         CONCAT420(fStack_128c,
                                                   CONCAT416(fStack_1290,
                                                             CONCAT412(fStack_1294,
                                                                       CONCAT48(fStack_1298,
                                                                                CONCAT44(fStack_129c
                                                                                         ,local_12a0
                                                                                        ))))))));
  auVar4 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar53 = ZEXT3264(CONCAT428(uStack_12c4,
                               CONCAT424(fStack_12c8,
                                         CONCAT420(fStack_12cc,
                                                   CONCAT416(fStack_12d0,
                                                             CONCAT412(fStack_12d4,
                                                                       CONCAT48(fStack_12d8,
                                                                                CONCAT44(fStack_12dc
                                                                                         ,local_12e0
                                                                                        ))))))));
  auVar2 = vblendvps_avx(auVar38,auVar3,auVar2);
  auVar38._0_4_ = auVar42._0_4_ * local_1150;
  auVar38._4_4_ = auVar42._4_4_ * auVar8._4_4_;
  auVar38._8_4_ = auVar42._8_4_ * auVar8._8_4_;
  auVar38._12_4_ = auVar42._12_4_ * auVar8._12_4_;
  local_11b0 = auVar2._0_4_;
  auVar42._0_4_ = auVar9._0_4_ * local_11b0;
  auVar42._4_4_ = auVar9._4_4_ * auVar2._4_4_;
  auVar42._8_4_ = auVar9._8_4_ * auVar2._8_4_;
  auVar42._12_4_ = auVar9._12_4_ * auVar2._12_4_;
  local_1338 = (ulong)(local_1150 < 0.0) << 4;
  uVar25 = local_1338 ^ 0x10;
  local_fa0[0] = *(ulong *)&pAVar24[1].bounds.bounds0.lower.field_0;
  local_fa0[1] = uVar17;
  local_1160 = (uint)auVar38._0_4_ ^ local_1230;
  uStack_115c = (uint)auVar38._0_4_ ^ uStack_122c;
  uStack_1158 = (uint)auVar38._0_4_ ^ uStack_1228;
  uStack_1154 = (uint)auVar38._0_4_ ^ uStack_1224;
  local_1170 = vshufps_avx(auVar8,auVar8,0x55);
  auVar9 = vshufps_avx(auVar38,auVar38,0x55);
  local_1180 = auVar9._0_4_ ^ local_1230;
  uStack_117c = auVar9._4_4_ ^ uStack_122c;
  uStack_1178 = auVar9._8_4_ ^ uStack_1228;
  uStack_1174 = auVar9._12_4_ ^ uStack_1224;
  local_1190 = vshufps_avx(auVar8,auVar8,0xaa);
  auVar8 = vshufps_avx(auVar38,auVar38,0xaa);
  local_11a0 = auVar8._0_4_ ^ local_1230;
  uStack_119c = auVar8._4_4_ ^ uStack_122c;
  uStack_1198 = auVar8._8_4_ ^ uStack_1228;
  uStack_1194 = auVar8._12_4_ ^ uStack_1224;
  local_11c0 = (uint)auVar42._0_4_ ^ local_1230;
  uStack_11bc = (uint)auVar42._0_4_ ^ uStack_122c;
  uStack_11b8 = (uint)auVar42._0_4_ ^ uStack_1228;
  uStack_11b4 = (uint)auVar42._0_4_ ^ uStack_1224;
  local_11d0 = vshufps_avx(auVar2,auVar2,0x55);
  auVar8 = vshufps_avx(auVar42,auVar42,0x55);
  local_11e0._0_4_ = auVar8._0_4_ ^ local_1230;
  local_11e0._4_4_ = auVar8._4_4_ ^ uStack_122c;
  local_11e0._8_4_ = auVar8._8_4_ ^ uStack_1228;
  local_11e0._12_4_ = auVar8._12_4_ ^ uStack_1224;
  local_11f0 = vshufps_avx(auVar2,auVar2,0xaa);
  auVar8 = vshufps_avx(auVar42,auVar42,0xaa);
  local_1200 = auVar8._0_4_ ^ local_1230;
  uStack_11fc = auVar8._4_4_ ^ uStack_122c;
  uStack_11f8 = auVar8._8_4_ ^ uStack_1228;
  uStack_11f4 = auVar8._12_4_ ^ uStack_1224;
  local_1210 = auVar5._0_4_;
  local_1220 = auVar4._0_4_;
  auVar30._4_4_ = uStack_109c;
  auVar30._0_4_ = local_10a0;
  auVar30._8_4_ = uStack_1098;
  auVar30._12_4_ = uStack_1094;
  auVar30._16_4_ = uStack_1090;
  auVar30._20_4_ = uStack_108c;
  auVar30._24_4_ = uStack_1088;
  auVar30._28_4_ = uStack_1084;
  local_fe0 = vblendvps_avx(auVar30,local_1060,local_1280);
  auVar33 = ZEXT3264(local_fe0);
  auVar51 = ZEXT3264(CONCAT428(uStack_12a4,
                               CONCAT424(fStack_12a8,
                                         CONCAT420(fStack_12ac,
                                                   CONCAT416(fStack_12b0,
                                                             CONCAT412(fStack_12b4,
                                                                       CONCAT48(fStack_12b8,
                                                                                CONCAT44(fStack_12bc
                                                                                         ,local_12c0
                                                                                        ))))))));
  uStack_121c = local_1220;
  uStack_1218 = local_1220;
  uStack_1214 = local_1220;
  uStack_120c = local_1210;
  uStack_1208 = local_1210;
  uStack_1204 = local_1210;
  fStack_11ac = local_11b0;
  fStack_11a8 = local_11b0;
  fStack_11a4 = local_11b0;
  fStack_114c = local_1150;
  fStack_1148 = local_1150;
  fStack_1144 = local_1150;
LAB_0060fd1d:
  auVar30 = auVar33._0_32_;
  if (puVar19 != local_fa0) {
    puVar22 = puVar19 + -2;
    uVar16 = vmovmskps_avx(local_1320);
    uVar17 = ~CONCAT44((int)(uVar17 >> 0x20),uVar16) & puVar19[-1];
    if (uVar17 != 0) {
      uVar27 = *puVar22;
      do {
        if ((uVar27 & 8) != 0) {
          if (uVar17 != 0) {
            aVar32._0_8_ = local_1320._0_8_ ^ 0xffffffffffffffff;
            aVar32._8_4_ = local_1320._8_4_ ^ 0xffffffff;
            aVar32._12_4_ = local_1320._12_4_ ^ 0xffffffff;
            aVar32._16_4_ = local_1320._16_4_ ^ 0xffffffff;
            aVar32._20_4_ = local_1320._20_4_ ^ 0xffffffff;
            aVar32._24_4_ = local_1320._24_4_ ^ 0xffffffff;
            aVar32._28_4_ = local_1320._28_4_ ^ 0xffffffff;
            pvVar18 = (vbool<8> *)((ulong)((uint)uVar27 & 0xf) - 8);
            local_1300 = aVar32;
            if (pvVar18 == (vbool<8> *)0x0) goto LAB_0060ffcd;
            prim = (Primitive *)(uVar27 & 0xfffffffffffffff0);
            local_1360 = (vbool<8> *)0x1;
            local_1340 = pvVar18;
            goto LAB_0060ff64;
          }
          break;
        }
        auVar8._4_4_ = uStack_115c;
        auVar8._0_4_ = local_1160;
        auVar8._8_4_ = uStack_1158;
        auVar8._12_4_ = uStack_1154;
        auVar12._4_4_ = fStack_114c;
        auVar12._0_4_ = local_1150;
        auVar12._8_4_ = fStack_1148;
        auVar12._12_4_ = fStack_1144;
        auVar8 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + local_1338),auVar8,auVar12);
        auVar11._4_4_ = uStack_117c;
        auVar11._0_4_ = local_1180;
        auVar11._8_4_ = uStack_1178;
        auVar11._12_4_ = uStack_1174;
        auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + local_1328),auVar11,
                                 local_1170);
        auVar8 = vpmaxsd_avx(auVar8,auVar9);
        auVar10._4_4_ = uStack_119c;
        auVar10._0_4_ = local_11a0;
        auVar10._8_4_ = uStack_1198;
        auVar10._12_4_ = uStack_1194;
        auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar26),auVar10,local_1190);
        auVar3._4_4_ = uStack_120c;
        auVar3._0_4_ = local_1210;
        auVar3._8_4_ = uStack_1208;
        auVar3._12_4_ = uStack_1204;
        auVar9 = vpmaxsd_avx(auVar9,auVar3);
        auVar8 = vpmaxsd_avx(auVar8,auVar9);
        auVar9._4_4_ = uStack_11bc;
        auVar9._0_4_ = local_11c0;
        auVar9._8_4_ = uStack_11b8;
        auVar9._12_4_ = uStack_11b4;
        auVar5._4_4_ = fStack_11ac;
        auVar5._0_4_ = local_11b0;
        auVar5._8_4_ = fStack_11a8;
        auVar5._12_4_ = fStack_11a4;
        auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar25),auVar9,auVar5);
        auVar42 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + local_1330),local_11e0,
                                  local_11d0);
        auVar9 = vpminsd_avx(auVar9,auVar42);
        auVar4._4_4_ = uStack_11fc;
        auVar4._0_4_ = local_1200;
        auVar4._8_4_ = uStack_11f8;
        auVar4._12_4_ = uStack_11f4;
        auVar42 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + (uVar26 ^ 0x10)),auVar4,
                                  local_11f0);
        auVar2._4_4_ = uStack_121c;
        auVar2._0_4_ = local_1220;
        auVar2._8_4_ = uStack_1218;
        auVar2._12_4_ = uStack_1214;
        auVar42 = vpminsd_avx(auVar42,auVar2);
        auVar9 = vpminsd_avx(auVar9,auVar42);
        auVar8 = vcmpps_avx(auVar8,auVar9,2);
        auVar33 = ZEXT1664(auVar8);
        uVar15 = vmovmskps_avx(auVar8);
        if (uVar15 == 0) {
          bVar28 = false;
        }
        else {
          uVar23 = (ulong)(uVar15 & 0xff);
          uVar17 = 0;
          uVar20 = 8;
          do {
            lVar7 = 0;
            for (uVar21 = uVar23; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              lVar7 = lVar7 + 1;
            }
            uVar16 = *(undefined4 *)(uVar27 + 0x20 + lVar7 * 4);
            auVar31._4_4_ = uVar16;
            auVar31._0_4_ = uVar16;
            auVar31._8_4_ = uVar16;
            auVar31._12_4_ = uVar16;
            auVar31._16_4_ = uVar16;
            auVar31._20_4_ = uVar16;
            auVar31._24_4_ = uVar16;
            auVar31._28_4_ = uVar16;
            uVar16 = *(undefined4 *)(uVar27 + 0x40 + lVar7 * 4);
            auVar35._4_4_ = uVar16;
            auVar35._0_4_ = uVar16;
            auVar35._8_4_ = uVar16;
            auVar35._12_4_ = uVar16;
            auVar35._16_4_ = uVar16;
            auVar35._20_4_ = uVar16;
            auVar35._24_4_ = uVar16;
            auVar35._28_4_ = uVar16;
            auVar8 = vfmadd213ps_fma(auVar31,auVar54._0_32_,auVar50._0_32_);
            auVar9 = vfmadd213ps_fma(auVar35,auVar55._0_32_,auVar51._0_32_);
            uVar16 = *(undefined4 *)(uVar27 + 0x60 + lVar7 * 4);
            auVar41._4_4_ = uVar16;
            auVar41._0_4_ = uVar16;
            auVar41._8_4_ = uVar16;
            auVar41._12_4_ = uVar16;
            auVar41._16_4_ = uVar16;
            auVar41._20_4_ = uVar16;
            auVar41._24_4_ = uVar16;
            auVar41._28_4_ = uVar16;
            auVar42 = vfmadd213ps_fma(auVar41,auVar56._0_32_,auVar53._0_32_);
            uVar16 = *(undefined4 *)(uVar27 + 0x30 + lVar7 * 4);
            auVar43._4_4_ = uVar16;
            auVar43._0_4_ = uVar16;
            auVar43._8_4_ = uVar16;
            auVar43._12_4_ = uVar16;
            auVar43._16_4_ = uVar16;
            auVar43._20_4_ = uVar16;
            auVar43._24_4_ = uVar16;
            auVar43._28_4_ = uVar16;
            auVar2 = vfmadd213ps_fma(auVar43,auVar54._0_32_,auVar50._0_32_);
            uVar16 = *(undefined4 *)(uVar27 + 0x50 + lVar7 * 4);
            auVar47._4_4_ = uVar16;
            auVar47._0_4_ = uVar16;
            auVar47._8_4_ = uVar16;
            auVar47._12_4_ = uVar16;
            auVar47._16_4_ = uVar16;
            auVar47._20_4_ = uVar16;
            auVar47._24_4_ = uVar16;
            auVar47._28_4_ = uVar16;
            uVar16 = *(undefined4 *)(uVar27 + 0x70 + lVar7 * 4);
            auVar48._4_4_ = uVar16;
            auVar48._0_4_ = uVar16;
            auVar48._8_4_ = uVar16;
            auVar48._12_4_ = uVar16;
            auVar48._16_4_ = uVar16;
            auVar48._20_4_ = uVar16;
            auVar48._24_4_ = uVar16;
            auVar48._28_4_ = uVar16;
            auVar38 = vfmadd213ps_fma(auVar47,auVar55._0_32_,auVar51._0_32_);
            auVar3 = vfmadd213ps_fma(auVar48,auVar56._0_32_,auVar53._0_32_);
            auVar30 = vpminsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar2));
            auVar34 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar38));
            auVar30 = vpmaxsd_avx2(auVar30,auVar34);
            auVar34 = vpminsd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar3));
            auVar34 = vpmaxsd_avx2(auVar34,local_fe0);
            auVar30 = vpmaxsd_avx2(auVar30,auVar34);
            auVar34 = vpmaxsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar2));
            auVar40 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar38));
            auVar40 = vpminsd_avx2(auVar34,auVar40);
            auVar34 = vpmaxsd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar3));
            auVar34 = vpminsd_avx2(auVar34,local_1260);
            auVar34 = vpminsd_avx2(auVar40,auVar34);
            auVar30 = vcmpps_avx(auVar30,auVar34,2);
            auVar33 = ZEXT3264(auVar30);
            uVar21 = uVar20;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0x7f,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0xbf,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar30[0x1f] < '\0') {
              uVar21 = *(ulong *)(uVar27 + lVar7 * 8);
              if (uVar20 != 8) {
                *puVar22 = uVar20;
                puVar22[1] = uVar17;
                puVar22 = puVar22 + 2;
              }
              uVar15 = vmovmskps_avx(auVar30);
              uVar17 = (ulong)uVar15;
            }
            uVar23 = uVar23 - 1 & uVar23;
            uVar20 = uVar21;
          } while (uVar23 != 0);
          bVar28 = uVar21 != 8;
          uVar27 = uVar21;
        }
      } while (bVar28);
    }
    uVar17 = 0;
    puVar19 = puVar22;
    goto LAB_00610082;
  }
  goto LAB_00610093;
  while( true ) {
    prim = prim + 1;
    pvVar18 = (vbool<8> *)((long)&local_1360->field_0 + 1);
    bVar28 = local_1340 <= local_1360;
    local_1360 = pvVar18;
    if (bVar28) break;
LAB_0060ff64:
    pvVar18 = InstanceIntersectorK<8>::occluded
                        ((vbool<8> *)&local_fc0.field_1,(vbool<8> *)&local_1300.field_1,&local_1371,
                         ray,local_1348,prim);
    aVar1.v = (__m256)vandnps_avx(local_fc0.v,local_1300.v);
    auVar30 = (undefined1  [32])local_1300 & ~(undefined1  [32])local_fc0;
    ray = local_1350;
    aVar32 = local_fc0;
    local_1300 = aVar1;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar30 >> 0x7f,0) == '\0') &&
          (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar30 >> 0xbf,0) == '\0') &&
        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar30[0x1f])
    break;
  }
LAB_0060ffcd:
  auVar30 = vpcmpeqd_avx2((undefined1  [32])aVar32,(undefined1  [32])aVar32);
  local_1320 = vpor_avx2(local_1320,auVar30 ^ (undefined1  [32])local_1300);
  auVar30 = vpandn_avx2(local_1320,local_1280);
  auVar33 = ZEXT3264(auVar30);
  local_1280 = local_1280 & ~local_1320;
  if ((((((((local_1280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (local_1280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_1280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(local_1280 >> 0x7f,0) == '\0') &&
        (local_1280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(local_1280 >> 0xbf,0) == '\0') &&
      (local_1280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
      -1 < local_1280[0x1f]) {
    uVar17 = CONCAT71((int7)((ulong)pvVar18 >> 8),1);
  }
  else {
    auVar36._8_4_ = 0xff800000;
    auVar36._0_8_ = 0xff800000ff800000;
    auVar36._12_4_ = 0xff800000;
    auVar36._16_4_ = 0xff800000;
    auVar36._20_4_ = 0xff800000;
    auVar36._24_4_ = 0xff800000;
    auVar36._28_4_ = 0xff800000;
    local_1260 = vblendvps_avx(local_1260,auVar36,local_1320);
    uVar17 = 0;
  }
  auVar54 = ZEXT3264(local_1100);
  auVar55 = ZEXT3264(local_1120);
  auVar56 = ZEXT3264(local_1140);
  auVar50 = ZEXT3264(CONCAT428(uStack_1284,
                               CONCAT424(fStack_1288,
                                         CONCAT420(fStack_128c,
                                                   CONCAT416(fStack_1290,
                                                             CONCAT412(fStack_1294,
                                                                       CONCAT48(fStack_1298,
                                                                                CONCAT44(fStack_129c
                                                                                         ,local_12a0
                                                                                        ))))))));
  auVar51 = ZEXT3264(CONCAT428(uStack_12a4,
                               CONCAT424(fStack_12a8,
                                         CONCAT420(fStack_12ac,
                                                   CONCAT416(fStack_12b0,
                                                             CONCAT412(fStack_12b4,
                                                                       CONCAT48(fStack_12b8,
                                                                                CONCAT44(fStack_12bc
                                                                                         ,local_12c0
                                                                                        ))))))));
  auVar53 = ZEXT3264(CONCAT428(uStack_12c4,
                               CONCAT424(fStack_12c8,
                                         CONCAT420(fStack_12cc,
                                                   CONCAT416(fStack_12d0,
                                                             CONCAT412(fStack_12d4,
                                                                       CONCAT48(fStack_12d8,
                                                                                CONCAT44(fStack_12dc
                                                                                         ,local_12e0
                                                                                        ))))))));
  puVar19 = puVar22;
  pAVar24 = local_1370;
  local_1280 = auVar30;
LAB_00610082:
  auVar30 = auVar33._0_32_;
  if ((char)uVar17 != '\0') goto LAB_00610093;
  goto LAB_0060fd1d;
LAB_00610093:
  if (local_1368 == 0) {
    auVar30 = vpcmpeqd_avx2(auVar30,auVar30);
    auVar30 = vpcmpeqd_avx2(auVar30,(undefined1  [32])local_10c0);
    auVar30 = vpand_avx2(auVar30,local_1320);
    auVar37._8_4_ = 0xff800000;
    auVar37._0_8_ = 0xff800000ff800000;
    auVar37._12_4_ = 0xff800000;
    auVar37._16_4_ = 0xff800000;
    auVar37._20_4_ = 0xff800000;
    auVar37._24_4_ = 0xff800000;
    auVar37._28_4_ = 0xff800000;
    auVar30 = vmaskmovps_avx(auVar30,auVar37);
    *(undefined1 (*) [32])local_1358 = auVar30;
    return;
  }
  goto LAB_0060f8f1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }